

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

size_t __thiscall SigningCertificate::SetDataSize(SigningCertificate *this)

{
  size_t sVar1;
  size_t sVar2;
  SigningCertificate *this_local;
  
  sVar1 = GetEncodedSize<ESSCertID>(&this->certs);
  sVar2 = GetEncodedSize<PolicyInformation>(&this->policies);
  (this->super_DerBase).cbData = sVar1 + sVar2;
  return sVar1 + sVar2;
}

Assistant:

virtual size_t SetDataSize() override
	{
		return (cbData = GetEncodedSize(certs) + GetEncodedSize(policies));
	}